

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-out.c
# Opt level: O0

CURLcode cw_out_buf_flush(cw_out_ctx *ctx,Curl_easy *data,cw_out_buf *cwbuf,_Bool flush_all)

{
  cw_out_type otype;
  byte bVar1;
  cw_out_buf *data_00;
  Curl_easy *ctx_00;
  size_t sVar2;
  char *buf;
  size_t sVar3;
  dynbuf *s;
  size_t local_38;
  size_t consumed;
  CURLcode result;
  _Bool flush_all_local;
  cw_out_buf *cwbuf_local;
  Curl_easy *data_local;
  cw_out_ctx *ctx_local;
  
  consumed._0_4_ = CURLE_OK;
  consumed._7_1_ = flush_all;
  _result = cwbuf;
  cwbuf_local = (cw_out_buf *)data;
  data_local = (Curl_easy *)ctx;
  sVar2 = Curl_dyn_len(&cwbuf->b);
  ctx_00 = data_local;
  data_00 = cwbuf_local;
  bVar1 = consumed._7_1_;
  if (sVar2 != 0) {
    otype = _result->type;
    buf = Curl_dyn_ptr(&_result->b);
    sVar2 = Curl_dyn_len(&_result->b);
    consumed._0_4_ =
         cw_out_ptr_flush((cw_out_ctx *)ctx_00,(Curl_easy *)data_00,otype,(_Bool)(bVar1 & 1),buf,
                          sVar2,&local_38);
    sVar2 = local_38;
    if ((CURLcode)consumed != CURLE_OK) {
      return (CURLcode)consumed;
    }
    if (local_38 != 0) {
      sVar3 = Curl_dyn_len(&_result->b);
      if (sVar2 == sVar3) {
        Curl_dyn_free(&_result->b);
      }
      else {
        s = &_result->b;
        sVar2 = Curl_dyn_len(&_result->b);
        consumed._0_4_ = Curl_dyn_tail(s,sVar2 - local_38);
        if ((CURLcode)consumed != CURLE_OK) {
          return (CURLcode)consumed;
        }
      }
    }
  }
  return (CURLcode)consumed;
}

Assistant:

static CURLcode cw_out_buf_flush(struct cw_out_ctx *ctx,
                                 struct Curl_easy *data,
                                 struct cw_out_buf *cwbuf,
                                 bool flush_all)
{
  CURLcode result = CURLE_OK;

  if(Curl_dyn_len(&cwbuf->b)) {
    size_t consumed;

    result = cw_out_ptr_flush(ctx, data, cwbuf->type, flush_all,
                              Curl_dyn_ptr(&cwbuf->b),
                              Curl_dyn_len(&cwbuf->b),
                              &consumed);
    if(result)
      return result;

    if(consumed) {
      if(consumed == Curl_dyn_len(&cwbuf->b)) {
        Curl_dyn_free(&cwbuf->b);
      }
      else {
        DEBUGASSERT(consumed < Curl_dyn_len(&cwbuf->b));
        result = Curl_dyn_tail(&cwbuf->b, Curl_dyn_len(&cwbuf->b) - consumed);
        if(result)
          return result;
      }
    }
  }
  return result;
}